

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

int divsufsortxx::substring::compare<char*,bitmap::BitmapArray<long>::iterator>
              (char *T,iterator p1,iterator p2,value_type depth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  BitmapArray<long> *pBVar5;
  char *pcVar6;
  BitmapArray<long> *pBVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  
  pBVar5 = p2.array_;
  pBVar7 = p1.array_;
  iVar1 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,p1.pos_);
  pcVar10 = T + CONCAT44(extraout_var,iVar1) + depth;
  iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,p2.pos_);
  pcVar11 = T + CONCAT44(extraout_var_00,iVar2) + depth;
  iVar3 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,p1.pos_ + 1);
  iVar4 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,p2.pos_ + 1);
  pcVar6 = T + CONCAT44(extraout_var_02,iVar4) + 2;
  bVar12 = pcVar11 < pcVar6;
  bVar13 = pcVar10 < T + CONCAT44(extraout_var_01,iVar3) + 2;
  if (((bVar13) && (pcVar11 < pcVar6)) && (*pcVar10 == *pcVar11)) {
    pcVar8 = T + CONCAT44(extraout_var_00,iVar2);
    pcVar9 = T + CONCAT44(extraout_var,iVar1);
    do {
      pcVar9 = pcVar9 + 1;
      pcVar8 = pcVar8 + 1;
      pcVar10 = pcVar9 + depth;
      pcVar11 = pcVar8 + depth;
      bVar12 = pcVar11 < pcVar6;
      bVar13 = pcVar10 < T + CONCAT44(extraout_var_01,iVar3) + 2;
      if ((!bVar13) || (pcVar6 <= pcVar11)) break;
    } while (*pcVar10 == *pcVar11);
  }
  if (bVar13) {
    iVar1 = 1;
    if (bVar12) {
      iVar1 = (uint)(*pcVar11 < *pcVar10) * 2 + -1;
    }
  }
  else {
    iVar1 = -(uint)bVar12;
  }
  return iVar1;
}

Assistant:

int compare(StringIterator_type T, const SAIterator_type p1,
            const SAIterator_type p2,
            typename std::iterator_traits<SAIterator_type>::value_type depth) {
  StringIterator_type U1 = T + depth + *p1, U2 = T + depth + *p2, U1n = T
      + *(p1 + 1) + 2, U2n = T + *(p2 + 1) + 2;
  for (; (U1 < U1n) && (U2 < U2n) && (*U1 == *U2); ++U1, ++U2) {
  }

  return U1 < U1n ? (U2 < U2n ? (*U2 < *U1) * 2 - 1 : 1) :
//        (U2 < U2n ? *U1 - *U2 : 1) :
      (U2 < U2n ? -1 : 0);
}